

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

void __thiscall
cmTarget::cmTarget(cmTarget *this,string *name,TargetType type,Visibility vis,cmMakefile *mf)

{
  cmMakefile *pcVar1;
  bool bVar2;
  int iVar3;
  TargetType TVar4;
  char *pcVar5;
  reference pbVar6;
  cmTargetInternals *pcVar7;
  cmTargetInternals *pcVar8;
  const_iterator __first;
  const_iterator __last;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar9;
  iterator __first_00;
  iterator __last_00;
  cmStringRange cVar10;
  cmBacktraceRange cVar11;
  bool local_105a;
  bool local_1041;
  allocator local_fb1;
  string local_fb0;
  allocator local_f89;
  string local_f88;
  allocator local_f61;
  string local_f60;
  allocator local_f39;
  string local_f38;
  allocator local_f11;
  string local_f10;
  allocator local_ee9;
  string local_ee8;
  allocator local_ec1;
  string local_ec0;
  allocator local_e99;
  string local_e98;
  allocator local_e71;
  string local_e70;
  allocator local_e49;
  string local_e48;
  allocator local_e21;
  string local_e20;
  allocator local_df9;
  string local_df8;
  cmListFileBacktrace *local_dd8;
  cmListFileBacktrace *local_dd0;
  __normal_iterator<const_cmListFileBacktrace_*,_std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>_>
  local_dc8;
  __normal_iterator<cmListFileBacktrace_*,_std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>_>
  local_dc0;
  const_iterator local_db8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_db0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_da8;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_da0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_d98;
  const_iterator local_d90;
  undefined1 local_d88 [8];
  cmBacktraceRange parentOptionsBts;
  cmStringRange parentOptions;
  undefined1 local_d58 [8];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parentSystemIncludes;
  __normal_iterator<cmListFileBacktrace_*,_std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>_>
  local_d10;
  const_iterator local_d08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_cf8;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_cf0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_ce8;
  const_iterator local_ce0;
  undefined1 local_cd8 [8];
  cmBacktraceRange parentIncludesBts;
  cmStringRange parentIncludes;
  undefined1 local_c98 [8];
  string property_1;
  undefined1 local_c70 [8];
  string property;
  char **p;
  string configUpper;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_c20;
  iterator ci;
  char *configProps [8];
  undefined1 local_bb8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configNames;
  string local_b98;
  allocator local_b71;
  string local_b70;
  allocator local_b49;
  string local_b48;
  allocator local_b21;
  string local_b20;
  allocator local_af9;
  string local_af8;
  allocator local_ad1;
  string local_ad0;
  allocator local_aa9;
  string local_aa8;
  allocator local_a81;
  string local_a80;
  allocator local_a59;
  string local_a58;
  allocator local_a31;
  string local_a30;
  allocator local_a09;
  string local_a08;
  allocator local_9e1;
  string local_9e0;
  allocator local_9b9;
  string local_9b8;
  allocator local_991;
  string local_990;
  allocator local_969;
  string local_968;
  allocator local_941;
  string local_940;
  allocator local_919;
  string local_918;
  allocator local_8f1;
  string local_8f0;
  allocator local_8c9;
  string local_8c8;
  allocator local_8a1;
  string local_8a0;
  allocator local_879;
  string local_878;
  allocator local_851;
  string local_850;
  allocator local_829;
  string local_828;
  allocator local_801;
  string local_800;
  allocator local_7d9;
  string local_7d8;
  allocator local_7b1;
  string local_7b0;
  allocator local_789;
  string local_788;
  allocator local_761;
  string local_760;
  allocator local_739;
  string local_738;
  allocator local_711;
  string local_710;
  allocator local_6e9;
  string local_6e8;
  allocator local_6c1;
  string local_6c0;
  allocator local_699;
  string local_698;
  allocator local_671;
  string local_670;
  allocator local_649;
  string local_648;
  allocator local_621;
  string local_620;
  allocator local_5f9;
  string local_5f8;
  allocator local_5d1;
  string local_5d0;
  allocator local_5a9;
  string local_5a8;
  allocator local_581;
  string local_580;
  allocator local_559;
  string local_558;
  allocator local_531;
  string local_530;
  allocator local_509;
  string local_508;
  allocator local_4e1;
  string local_4e0;
  allocator local_4b9;
  string local_4b8;
  allocator local_491;
  string local_490;
  allocator local_469;
  string local_468;
  allocator local_441;
  string local_440;
  allocator local_419;
  string local_418;
  allocator local_3f1;
  string local_3f0;
  allocator local_3c9;
  string local_3c8;
  allocator local_3a1;
  string local_3a0;
  allocator local_379;
  string local_378;
  allocator local_351;
  string local_350;
  allocator local_329;
  string local_328;
  allocator local_301;
  string local_300;
  allocator local_2d9;
  string local_2d8;
  allocator local_2b1;
  string local_2b0;
  allocator local_289;
  string local_288;
  allocator local_261;
  string local_260;
  allocator local_239;
  string local_238;
  allocator local_211;
  string local_210;
  allocator local_1e9;
  string local_1e8;
  allocator local_1c1;
  string local_1c0;
  allocator local_199;
  string local_198;
  allocator local_171;
  string local_170;
  allocator local_149;
  string local_148;
  allocator local_121;
  string local_120;
  allocator local_f9;
  string local_f8;
  allocator local_d1;
  string local_d0;
  byte local_ab;
  byte local_aa;
  allocator local_a9;
  string local_a8;
  byte local_83;
  byte local_82;
  allocator local_81;
  string local_80;
  allocator local_59;
  string local_58;
  cmMakefile *local_28;
  cmMakefile *mf_local;
  Visibility vis_local;
  TargetType type_local;
  string *name_local;
  cmTarget *this_local;
  
  local_28 = mf;
  mf_local._0_4_ = vis;
  mf_local._4_4_ = type;
  _vis_local = name;
  name_local = (string *)this;
  cmPropertyMap::cmPropertyMap(&this->Properties);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->SystemIncludeDirectories);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->LinkDirectoriesEmmitted);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->Utilities);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>_>_>
  ::map(&this->UtilityBacktraces);
  cmPolicies::PolicyMap::PolicyMap(&this->PolicyMap);
  std::__cxx11::string::string((string *)&this->Name);
  std::__cxx11::string::string((string *)&this->InstallPath);
  std::__cxx11::string::string((string *)&this->RuntimeInstallPath);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->LinkDirectories);
  std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>::vector(&this->PreBuildCommands);
  std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>::vector(&this->PreLinkCommands);
  std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>::vector(&this->PostBuildCommands);
  std::
  vector<std::pair<cmTarget::TLLSignature,_cmListFileContext>,_std::allocator<std::pair<cmTarget::TLLSignature,_cmListFileContext>_>_>
  ::vector(&this->TLLCommands);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_>_>
  ::vector(&this->OriginalLinkLibraries);
  cmTargetInternalPointer::cmTargetInternalPointer(&this->Internal);
  cmListFileBacktrace::cmListFileBacktrace(&this->Backtrace);
  if (local_28 == (cmMakefile *)0x0) {
    __assert_fail("mf",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmTarget.cxx"
                  ,0xb5,
                  "cmTarget::cmTarget(const std::string &, cmStateEnums::TargetType, Visibility, cmMakefile *)"
                 );
  }
  std::__cxx11::string::operator=((string *)&this->Name,(string *)_vis_local);
  this->TargetTypeValue = mf_local._4_4_;
  this->Makefile = local_28;
  this->HaveInstallRule = false;
  this->DLLPlatform = false;
  this->IsAndroid = false;
  local_1041 = (Visibility)mf_local == VisibilityImported ||
               (Visibility)mf_local == VisibilityImportedGlobally;
  this->IsImportedTarget = local_1041;
  this->ImportedGloballyVisible = (Visibility)mf_local == VisibilityImportedGlobally;
  this->BuildInterfaceIncludesAppended = false;
  if (((int)this->TargetTypeValue < 1) || (3 < (int)this->TargetTypeValue)) {
    this->RecordDependencies = false;
  }
  else {
    this->RecordDependencies = true;
  }
  pcVar1 = this->Makefile;
  std::allocator<char>::allocator();
  local_82 = 0;
  local_83 = 0;
  local_aa = 0;
  local_ab = 0;
  std::__cxx11::string::string((string *)&local_58,"WIN32",&local_59);
  bVar2 = cmMakefile::IsOn(pcVar1,&local_58);
  local_105a = true;
  if (!bVar2) {
    pcVar1 = this->Makefile;
    std::allocator<char>::allocator();
    local_82 = 1;
    std::__cxx11::string::string((string *)&local_80,"CYGWIN",&local_81);
    local_83 = 1;
    bVar2 = cmMakefile::IsOn(pcVar1,&local_80);
    local_105a = true;
    if (!bVar2) {
      pcVar1 = this->Makefile;
      std::allocator<char>::allocator();
      local_aa = 1;
      std::__cxx11::string::string((string *)&local_a8,"MINGW",&local_a9);
      local_ab = 1;
      local_105a = cmMakefile::IsOn(pcVar1,&local_a8);
    }
  }
  this->DLLPlatform = local_105a;
  if ((local_ab & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_a8);
  }
  if ((local_aa & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  }
  if ((local_83 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_80);
  }
  if ((local_82 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
  }
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  pcVar1 = this->Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d0,"CMAKE_SYSTEM_NAME",&local_d1);
  pcVar5 = cmMakefile::GetSafeDefinition(pcVar1,&local_d0);
  iVar3 = strcmp(pcVar5,"Android");
  this->IsAndroid = iVar3 == 0;
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  TVar4 = GetType(this);
  if ((TVar4 != INTERFACE_LIBRARY) && (TVar4 = GetType(this), TVar4 != UTILITY)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_f8,"ANDROID_API",&local_f9);
    SetPropertyDefault(this,&local_f8,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_f9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_120,"ANDROID_API_MIN",&local_121);
    SetPropertyDefault(this,&local_120,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_120);
    std::allocator<char>::~allocator((allocator<char> *)&local_121);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_148,"ANDROID_ARCH",&local_149);
    SetPropertyDefault(this,&local_148,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_148);
    std::allocator<char>::~allocator((allocator<char> *)&local_149);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_170,"ANDROID_STL_TYPE",&local_171);
    SetPropertyDefault(this,&local_170,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_170);
    std::allocator<char>::~allocator((allocator<char> *)&local_171);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_198,"ANDROID_SKIP_ANT_STEP",&local_199);
    SetPropertyDefault(this,&local_198,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_198);
    std::allocator<char>::~allocator((allocator<char> *)&local_199);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1c0,"ANDROID_PROCESS_MAX",&local_1c1);
    SetPropertyDefault(this,&local_1c0,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1e8,"ANDROID_PROGUARD",&local_1e9);
    SetPropertyDefault(this,&local_1e8,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_210,"ANDROID_PROGUARD_CONFIG_PATH",&local_211);
    SetPropertyDefault(this,&local_210,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_210);
    std::allocator<char>::~allocator((allocator<char> *)&local_211);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_238,"ANDROID_SECURE_PROPS_PATH",&local_239);
    SetPropertyDefault(this,&local_238,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_238);
    std::allocator<char>::~allocator((allocator<char> *)&local_239);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_260,"ANDROID_NATIVE_LIB_DIRECTORIES",&local_261);
    SetPropertyDefault(this,&local_260,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_260);
    std::allocator<char>::~allocator((allocator<char> *)&local_261);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_288,"ANDROID_NATIVE_LIB_DEPENDENCIES",&local_289);
    SetPropertyDefault(this,&local_288,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_288);
    std::allocator<char>::~allocator((allocator<char> *)&local_289);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_2b0,"ANDROID_JAVA_SOURCE_DIR",&local_2b1);
    SetPropertyDefault(this,&local_2b0,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_2b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_2b1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_2d8,"ANDROID_JAR_DIRECTORIES",&local_2d9);
    SetPropertyDefault(this,&local_2d8,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_2d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_2d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_300,"ANDROID_JAR_DEPENDENCIES",&local_301);
    SetPropertyDefault(this,&local_300,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_300);
    std::allocator<char>::~allocator((allocator<char> *)&local_301);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_328,"ANDROID_ASSETS_DIRECTORIES",&local_329);
    SetPropertyDefault(this,&local_328,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_328);
    std::allocator<char>::~allocator((allocator<char> *)&local_329);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_350,"ANDROID_ANT_ADDITIONAL_OPTIONS",&local_351);
    SetPropertyDefault(this,&local_350,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_350);
    std::allocator<char>::~allocator((allocator<char> *)&local_351);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_378,"BUILD_RPATH",&local_379);
    SetPropertyDefault(this,&local_378,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_378);
    std::allocator<char>::~allocator((allocator<char> *)&local_379);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_3a0,"INSTALL_NAME_DIR",&local_3a1);
    SetPropertyDefault(this,&local_3a0,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_3a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_3a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_3c8,"INSTALL_RPATH",&local_3c9);
    SetPropertyDefault(this,&local_3c8,"");
    std::__cxx11::string::~string((string *)&local_3c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_3c9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_3f0,"INSTALL_RPATH_USE_LINK_PATH",&local_3f1);
    SetPropertyDefault(this,&local_3f0,"OFF");
    std::__cxx11::string::~string((string *)&local_3f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_3f1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_418,"INTERPROCEDURAL_OPTIMIZATION",&local_419);
    SetPropertyDefault(this,&local_418,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_418);
    std::allocator<char>::~allocator((allocator<char> *)&local_419);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_440,"SKIP_BUILD_RPATH",&local_441);
    SetPropertyDefault(this,&local_440,"OFF");
    std::__cxx11::string::~string((string *)&local_440);
    std::allocator<char>::~allocator((allocator<char> *)&local_441);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_468,"BUILD_WITH_INSTALL_RPATH",&local_469);
    SetPropertyDefault(this,&local_468,"OFF");
    std::__cxx11::string::~string((string *)&local_468);
    std::allocator<char>::~allocator((allocator<char> *)&local_469);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_490,"ARCHIVE_OUTPUT_DIRECTORY",&local_491);
    SetPropertyDefault(this,&local_490,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_490);
    std::allocator<char>::~allocator((allocator<char> *)&local_491);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_4b8,"LIBRARY_OUTPUT_DIRECTORY",&local_4b9);
    SetPropertyDefault(this,&local_4b8,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_4b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_4b9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_4e0,"RUNTIME_OUTPUT_DIRECTORY",&local_4e1);
    SetPropertyDefault(this,&local_4e0,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_4e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_4e1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_508,"PDB_OUTPUT_DIRECTORY",&local_509);
    SetPropertyDefault(this,&local_508,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_508);
    std::allocator<char>::~allocator((allocator<char> *)&local_509);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_530,"COMPILE_PDB_OUTPUT_DIRECTORY",&local_531);
    SetPropertyDefault(this,&local_530,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_530);
    std::allocator<char>::~allocator((allocator<char> *)&local_531);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_558,"Fortran_FORMAT",&local_559);
    SetPropertyDefault(this,&local_558,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_558);
    std::allocator<char>::~allocator((allocator<char> *)&local_559);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_580,"Fortran_MODULE_DIRECTORY",&local_581);
    SetPropertyDefault(this,&local_580,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_580);
    std::allocator<char>::~allocator((allocator<char> *)&local_581);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_5a8,"GNUtoMS",&local_5a9);
    SetPropertyDefault(this,&local_5a8,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_5a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_5a9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_5d0,"OSX_ARCHITECTURES",&local_5d1);
    SetPropertyDefault(this,&local_5d0,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_5d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_5d1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_5f8,"IOS_INSTALL_COMBINED",&local_5f9);
    SetPropertyDefault(this,&local_5f8,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_5f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_5f9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_620,"AUTOMOC",&local_621);
    SetPropertyDefault(this,&local_620,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_620);
    std::allocator<char>::~allocator((allocator<char> *)&local_621);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_648,"AUTOUIC",&local_649);
    SetPropertyDefault(this,&local_648,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_648);
    std::allocator<char>::~allocator((allocator<char> *)&local_649);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_670,"AUTORCC",&local_671);
    SetPropertyDefault(this,&local_670,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_670);
    std::allocator<char>::~allocator((allocator<char> *)&local_671);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_698,"AUTOMOC_DEPEND_FILTERS",&local_699);
    SetPropertyDefault(this,&local_698,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_698);
    std::allocator<char>::~allocator((allocator<char> *)&local_699);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_6c0,"AUTOMOC_MOC_OPTIONS",&local_6c1);
    SetPropertyDefault(this,&local_6c0,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_6c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_6c1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_6e8,"AUTOUIC_OPTIONS",&local_6e9);
    SetPropertyDefault(this,&local_6e8,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_6e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_6e9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_710,"AUTOUIC_SEARCH_PATHS",&local_711);
    SetPropertyDefault(this,&local_710,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_710);
    std::allocator<char>::~allocator((allocator<char> *)&local_711);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_738,"AUTORCC_OPTIONS",&local_739);
    SetPropertyDefault(this,&local_738,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_738);
    std::allocator<char>::~allocator((allocator<char> *)&local_739);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_760,"LINK_DEPENDS_NO_SHARED",&local_761);
    SetPropertyDefault(this,&local_760,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_760);
    std::allocator<char>::~allocator((allocator<char> *)&local_761);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_788,"LINK_INTERFACE_LIBRARIES",&local_789);
    SetPropertyDefault(this,&local_788,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_788);
    std::allocator<char>::~allocator((allocator<char> *)&local_789);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_7b0,"WIN32_EXECUTABLE",&local_7b1);
    SetPropertyDefault(this,&local_7b0,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_7b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_7b1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_7d8,"MACOSX_BUNDLE",&local_7d9);
    SetPropertyDefault(this,&local_7d8,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_7d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_7d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_800,"MACOSX_RPATH",&local_801);
    SetPropertyDefault(this,&local_800,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_800);
    std::allocator<char>::~allocator((allocator<char> *)&local_801);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_828,"BUILD_WITH_INSTALL_NAME_DIR",&local_829);
    SetPropertyDefault(this,&local_828,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_828);
    std::allocator<char>::~allocator((allocator<char> *)&local_829);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_850,"C_CLANG_TIDY",&local_851);
    SetPropertyDefault(this,&local_850,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_850);
    std::allocator<char>::~allocator((allocator<char> *)&local_851);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_878,"C_COMPILER_LAUNCHER",&local_879);
    SetPropertyDefault(this,&local_878,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_878);
    std::allocator<char>::~allocator((allocator<char> *)&local_879);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_8a0,"C_CPPLINT",&local_8a1);
    SetPropertyDefault(this,&local_8a0,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_8a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_8a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_8c8,"C_INCLUDE_WHAT_YOU_USE",&local_8c9);
    SetPropertyDefault(this,&local_8c8,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_8c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_8c9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_8f0,"LINK_WHAT_YOU_USE",&local_8f1);
    SetPropertyDefault(this,&local_8f0,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_8f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_8f1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_918,"C_STANDARD",&local_919);
    SetPropertyDefault(this,&local_918,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_918);
    std::allocator<char>::~allocator((allocator<char> *)&local_919);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_940,"C_STANDARD_REQUIRED",&local_941);
    SetPropertyDefault(this,&local_940,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_940);
    std::allocator<char>::~allocator((allocator<char> *)&local_941);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_968,"C_EXTENSIONS",&local_969);
    SetPropertyDefault(this,&local_968,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_968);
    std::allocator<char>::~allocator((allocator<char> *)&local_969);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_990,"CXX_CLANG_TIDY",&local_991);
    SetPropertyDefault(this,&local_990,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_990);
    std::allocator<char>::~allocator((allocator<char> *)&local_991);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_9b8,"CXX_COMPILER_LAUNCHER",&local_9b9);
    SetPropertyDefault(this,&local_9b8,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_9b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_9b9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_9e0,"CXX_CPPLINT",&local_9e1);
    SetPropertyDefault(this,&local_9e0,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_9e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_9e1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_a08,"CXX_INCLUDE_WHAT_YOU_USE",&local_a09);
    SetPropertyDefault(this,&local_a08,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_a08);
    std::allocator<char>::~allocator((allocator<char> *)&local_a09);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_a30,"CXX_STANDARD",&local_a31);
    SetPropertyDefault(this,&local_a30,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_a30);
    std::allocator<char>::~allocator((allocator<char> *)&local_a31);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_a58,"CXX_STANDARD_REQUIRED",&local_a59);
    SetPropertyDefault(this,&local_a58,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_a58);
    std::allocator<char>::~allocator((allocator<char> *)&local_a59);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_a80,"CXX_EXTENSIONS",&local_a81);
    SetPropertyDefault(this,&local_a80,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_a80);
    std::allocator<char>::~allocator((allocator<char> *)&local_a81);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_aa8,"CUDA_STANDARD",&local_aa9);
    SetPropertyDefault(this,&local_aa8,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_aa8);
    std::allocator<char>::~allocator((allocator<char> *)&local_aa9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_ad0,"CUDA_STANDARD_REQUIRED",&local_ad1);
    SetPropertyDefault(this,&local_ad0,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_ad0);
    std::allocator<char>::~allocator((allocator<char> *)&local_ad1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_af8,"CUDA_EXTENSIONS",&local_af9);
    SetPropertyDefault(this,&local_af8,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_af8);
    std::allocator<char>::~allocator((allocator<char> *)&local_af9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_b20,"CUDA_COMPILER_LAUNCHER",&local_b21);
    SetPropertyDefault(this,&local_b20,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_b20);
    std::allocator<char>::~allocator((allocator<char> *)&local_b21);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_b48,"LINK_SEARCH_START_STATIC",&local_b49);
    SetPropertyDefault(this,&local_b48,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_b48);
    std::allocator<char>::~allocator((allocator<char> *)&local_b49);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_b70,"LINK_SEARCH_END_STATIC",&local_b71);
    SetPropertyDefault(this,&local_b70,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_b70);
    std::allocator<char>::~allocator((allocator<char> *)&local_b71);
  }
  TVar4 = GetType(this);
  if (TVar4 != UTILITY) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_b98,"NO_SYSTEM_FROM_IMPORTED",
               (allocator *)
               ((long)&configNames.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    SetPropertyDefault(this,&local_b98,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_b98);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&configNames.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_bb8);
  cmMakefile::GetConfigurations
            ((string *)(configProps + 7),local_28,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_bb8,true);
  std::__cxx11::string::~string((string *)(configProps + 7));
  TVar4 = GetType(this);
  if (TVar4 != UTILITY) {
    memcpy(&ci,&PTR_anon_var_dwarf_26110c_00cbc1f0,0x40);
    local_c20._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_bb8);
    while( true ) {
      configUpper.field_2._8_8_ =
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_bb8);
      bVar2 = __gnu_cxx::operator!=
                        (&local_c20,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)((long)&configUpper.field_2 + 8));
      if (!bVar2) break;
      pbVar6 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_c20);
      cmsys::SystemTools::UpperCase((string *)&p,pbVar6);
      for (property.field_2._8_8_ = &ci; *(long *)property.field_2._8_8_ != 0;
          property.field_2._8_8_ = property.field_2._8_8_ + 8) {
        if ((this->TargetTypeValue != INTERFACE_LIBRARY) ||
           (iVar3 = strcmp(*(char **)property.field_2._8_8_,"MAP_IMPORTED_CONFIG_"), iVar3 == 0)) {
          pcVar5 = *(char **)property.field_2._8_8_;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)local_c70,pcVar5,(allocator *)(property_1.field_2._M_local_buf + 0xf)
                    );
          std::allocator<char>::~allocator
                    ((allocator<char> *)(property_1.field_2._M_local_buf + 0xf));
          std::__cxx11::string::operator+=((string *)local_c70,(string *)&p);
          SetPropertyDefault(this,(string *)local_c70,(char *)0x0);
          std::__cxx11::string::~string((string *)local_c70);
        }
      }
      if ((this->TargetTypeValue != EXECUTABLE) && (this->TargetTypeValue != INTERFACE_LIBRARY)) {
        pbVar6 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&local_c20);
        cmsys::SystemTools::UpperCase((string *)local_c98,pbVar6);
        std::__cxx11::string::operator+=((string *)local_c98,"_POSTFIX");
        SetPropertyDefault(this,(string *)local_c98,(char *)0x0);
        std::__cxx11::string::~string((string *)local_c98);
      }
      std::__cxx11::string::~string((string *)&p);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_c20);
    }
  }
  cmMakefile::GetBacktrace((cmListFileBacktrace *)&parentIncludes.End,this->Makefile);
  cmListFileBacktrace::operator=(&this->Backtrace,(cmListFileBacktrace *)&parentIncludes.End);
  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&parentIncludes.End);
  bVar2 = IsImported(this);
  if (!bVar2) {
    cVar10 = cmMakefile::GetIncludeDirectoriesEntries_abi_cxx11_(this->Makefile);
    parentIncludes.Begin = cVar10.End._M_current;
    parentIncludesBts.End._M_current = (cmListFileBacktrace *)cVar10.Begin._M_current;
    cVar11 = cmMakefile::GetIncludeDirectoriesBacktraces(this->Makefile);
    parentIncludesBts.Begin = cVar11.End._M_current;
    local_cd8 = (undefined1  [8])cVar11.Begin._M_current;
    pcVar7 = cmTargetInternalPointer::operator->(&this->Internal);
    pcVar8 = cmTargetInternalPointer::operator->(&this->Internal);
    local_ce8._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(&pcVar8->IncludeDirectoriesEntries);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_ce0,&local_ce8);
    local_cf0._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
         ::begin((cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  *)&parentIncludesBts.End);
    local_cf8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ::end((cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       *)&parentIncludesBts.End);
    local_d00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           pcVar7,local_ce0,local_cf0,
                           (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            )local_cf8);
    pcVar7 = cmTargetInternalPointer::operator->(&this->Internal);
    pcVar8 = cmTargetInternalPointer::operator->(&this->Internal);
    local_d10._M_current =
         (cmListFileBacktrace *)
         std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::end
                   (&pcVar8->IncludeDirectoriesBacktraces);
    __gnu_cxx::
    __normal_iterator<cmListFileBacktrace_const*,std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>>
    ::__normal_iterator<cmListFileBacktrace*>
              ((__normal_iterator<cmListFileBacktrace_const*,std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>>
                *)&local_d08,&local_d10);
    __first = cmRange<__gnu_cxx::__normal_iterator<const_cmListFileBacktrace_*,_std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>_>_>
              ::begin((cmRange<__gnu_cxx::__normal_iterator<const_cmListFileBacktrace_*,_std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>_>_>
                       *)local_cd8);
    __last = cmRange<__gnu_cxx::__normal_iterator<const_cmListFileBacktrace_*,_std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>_>_>
             ::end((cmRange<__gnu_cxx::__normal_iterator<const_cmListFileBacktrace_*,_std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>_>_>
                    *)local_cd8);
    parentSystemIncludes._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>::
                 insert<__gnu_cxx::__normal_iterator<cmListFileBacktrace_const*,std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>>,void>
                           ((vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>> *)
                            &pcVar7->IncludeDirectoriesBacktraces,local_d08,
                            (__normal_iterator<const_cmListFileBacktrace_*,_std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>_>
                             )__first._M_current,
                            (__normal_iterator<const_cmListFileBacktrace_*,_std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>_>
                             )__last._M_current);
    psVar9 = cmMakefile::GetSystemIncludeDirectories_abi_cxx11_(this->Makefile);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_d58,psVar9);
    __first_00 = std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_d58);
    __last_00 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_d58);
    std::
    set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>::
    insert<std::_Rb_tree_const_iterator<std::__cxx11::string>>
              ((set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&this->SystemIncludeDirectories,
               (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )__first_00._M_node,
               (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )__last_00._M_node);
    cVar10 = cmMakefile::GetCompileOptionsEntries_abi_cxx11_(this->Makefile);
    parentOptionsBts.End._M_current = (cmListFileBacktrace *)cVar10.Begin._M_current;
    cVar11 = cmMakefile::GetCompileOptionsBacktraces(this->Makefile);
    parentOptionsBts.Begin = cVar11.End._M_current;
    local_d88 = (undefined1  [8])cVar11.Begin._M_current;
    pcVar7 = cmTargetInternalPointer::operator->(&this->Internal);
    pcVar8 = cmTargetInternalPointer::operator->(&this->Internal);
    local_d98._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(&pcVar8->CompileOptionsEntries);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_d90,&local_d98);
    local_da0._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
         ::begin((cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  *)&parentOptionsBts.End);
    local_da8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ::end((cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       *)&parentOptionsBts.End);
    local_db0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           &pcVar7->CompileOptionsEntries,local_d90,local_da0,
                           (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            )local_da8);
    pcVar7 = cmTargetInternalPointer::operator->(&this->Internal);
    pcVar8 = cmTargetInternalPointer::operator->(&this->Internal);
    local_dc0._M_current =
         (cmListFileBacktrace *)
         std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::end
                   (&pcVar8->CompileOptionsBacktraces);
    __gnu_cxx::
    __normal_iterator<cmListFileBacktrace_const*,std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>>
    ::__normal_iterator<cmListFileBacktrace*>
              ((__normal_iterator<cmListFileBacktrace_const*,std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>>
                *)&local_db8,&local_dc0);
    local_dc8._M_current =
         (cmListFileBacktrace *)
         cmRange<__gnu_cxx::__normal_iterator<const_cmListFileBacktrace_*,_std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>_>_>
         ::begin((cmRange<__gnu_cxx::__normal_iterator<const_cmListFileBacktrace_*,_std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>_>_>
                  *)local_d88);
    local_dd0 = (cmListFileBacktrace *)
                cmRange<__gnu_cxx::__normal_iterator<const_cmListFileBacktrace_*,_std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>_>_>
                ::end((cmRange<__gnu_cxx::__normal_iterator<const_cmListFileBacktrace_*,_std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>_>_>
                       *)local_d88);
    local_dd8 = (cmListFileBacktrace *)
                std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>::
                insert<__gnu_cxx::__normal_iterator<cmListFileBacktrace_const*,std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>>,void>
                          ((vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>> *)
                           &pcVar7->CompileOptionsBacktraces,local_db8,local_dc8,
                           (__normal_iterator<const_cmListFileBacktrace_*,_std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>_>
                            )local_dd0);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_d58);
  }
  TVar4 = GetType(this);
  if ((TVar4 != INTERFACE_LIBRARY) && (TVar4 = GetType(this), TVar4 != UTILITY)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_df8,"C_VISIBILITY_PRESET",&local_df9);
    SetPropertyDefault(this,&local_df8,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_df8);
    std::allocator<char>::~allocator((allocator<char> *)&local_df9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_e20,"CXX_VISIBILITY_PRESET",&local_e21);
    SetPropertyDefault(this,&local_e20,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_e20);
    std::allocator<char>::~allocator((allocator<char> *)&local_e21);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_e48,"CUDA_VISIBILITY_PRESET",&local_e49);
    SetPropertyDefault(this,&local_e48,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_e48);
    std::allocator<char>::~allocator((allocator<char> *)&local_e49);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_e70,"VISIBILITY_INLINES_HIDDEN",&local_e71);
    SetPropertyDefault(this,&local_e70,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_e70);
    std::allocator<char>::~allocator((allocator<char> *)&local_e71);
  }
  if (this->TargetTypeValue == EXECUTABLE) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_e98,"ANDROID_GUI",&local_e99);
    SetPropertyDefault(this,&local_e98,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_e98);
    std::allocator<char>::~allocator((allocator<char> *)&local_e99);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_ec0,"CROSSCOMPILING_EMULATOR",&local_ec1);
    SetPropertyDefault(this,&local_ec0,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_ec0);
    std::allocator<char>::~allocator((allocator<char> *)&local_ec1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_ee8,"ENABLE_EXPORTS",&local_ee9);
    SetPropertyDefault(this,&local_ee8,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_ee8);
    std::allocator<char>::~allocator((allocator<char> *)&local_ee9);
  }
  if ((this->TargetTypeValue == SHARED_LIBRARY) || (this->TargetTypeValue == MODULE_LIBRARY)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_f10,"POSITION_INDEPENDENT_CODE",&local_f11);
    SetProperty(this,&local_f10,"True");
    std::__cxx11::string::~string((string *)&local_f10);
    std::allocator<char>::~allocator((allocator<char> *)&local_f11);
  }
  if ((this->TargetTypeValue == SHARED_LIBRARY) || (this->TargetTypeValue == EXECUTABLE)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_f38,"WINDOWS_EXPORT_ALL_SYMBOLS",&local_f39);
    SetPropertyDefault(this,&local_f38,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_f38);
    std::allocator<char>::~allocator((allocator<char> *)&local_f39);
  }
  TVar4 = GetType(this);
  if ((TVar4 != INTERFACE_LIBRARY) && (TVar4 = GetType(this), TVar4 != UTILITY)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_f60,"POSITION_INDEPENDENT_CODE",&local_f61);
    SetPropertyDefault(this,&local_f60,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_f60);
    std::allocator<char>::~allocator((allocator<char> *)&local_f61);
  }
  cmMakefile::RecordPolicies(this->Makefile,&this->PolicyMap);
  if (this->TargetTypeValue == INTERFACE_LIBRARY) {
    cmPolicies::PolicyMap::Set(&this->PolicyMap,CMP0022,NEW);
  }
  TVar4 = GetType(this);
  if ((TVar4 != INTERFACE_LIBRARY) && (TVar4 = GetType(this), TVar4 != UTILITY)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_f88,"JOB_POOL_COMPILE",&local_f89);
    SetPropertyDefault(this,&local_f88,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_f88);
    std::allocator<char>::~allocator((allocator<char> *)&local_f89);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_fb0,"JOB_POOL_LINK",&local_fb1);
    SetPropertyDefault(this,&local_fb0,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_fb0);
    std::allocator<char>::~allocator((allocator<char> *)&local_fb1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_bb8);
  return;
}

Assistant:

cmTarget::cmTarget(std::string const& name, cmStateEnums::TargetType type,
                   Visibility vis, cmMakefile* mf)
{
  assert(mf);
  this->Name = name;
  this->TargetTypeValue = type;
  this->Makefile = mf;
  this->HaveInstallRule = false;
  this->DLLPlatform = false;
  this->IsAndroid = false;
  this->IsImportedTarget =
    (vis == VisibilityImported || vis == VisibilityImportedGlobally);
  this->ImportedGloballyVisible = vis == VisibilityImportedGlobally;
  this->BuildInterfaceIncludesAppended = false;

  // only add dependency information for library targets
  if (this->TargetTypeValue >= cmStateEnums::STATIC_LIBRARY &&
      this->TargetTypeValue <= cmStateEnums::MODULE_LIBRARY) {
    this->RecordDependencies = true;
  } else {
    this->RecordDependencies = false;
  }

  // Check whether this is a DLL platform.
  this->DLLPlatform =
    (this->Makefile->IsOn("WIN32") || this->Makefile->IsOn("CYGWIN") ||
     this->Makefile->IsOn("MINGW"));

  // Check whether we are targeting an Android platform.
  this->IsAndroid =
    strcmp(this->Makefile->GetSafeDefinition("CMAKE_SYSTEM_NAME"),
           "Android") == 0;

  // Setup default property values.
  if (this->GetType() != cmStateEnums::INTERFACE_LIBRARY &&
      this->GetType() != cmStateEnums::UTILITY) {
    this->SetPropertyDefault("ANDROID_API", CM_NULLPTR);
    this->SetPropertyDefault("ANDROID_API_MIN", CM_NULLPTR);
    this->SetPropertyDefault("ANDROID_ARCH", CM_NULLPTR);
    this->SetPropertyDefault("ANDROID_STL_TYPE", CM_NULLPTR);
    this->SetPropertyDefault("ANDROID_SKIP_ANT_STEP", CM_NULLPTR);
    this->SetPropertyDefault("ANDROID_PROCESS_MAX", CM_NULLPTR);
    this->SetPropertyDefault("ANDROID_PROGUARD", CM_NULLPTR);
    this->SetPropertyDefault("ANDROID_PROGUARD_CONFIG_PATH", CM_NULLPTR);
    this->SetPropertyDefault("ANDROID_SECURE_PROPS_PATH", CM_NULLPTR);
    this->SetPropertyDefault("ANDROID_NATIVE_LIB_DIRECTORIES", CM_NULLPTR);
    this->SetPropertyDefault("ANDROID_NATIVE_LIB_DEPENDENCIES", CM_NULLPTR);
    this->SetPropertyDefault("ANDROID_JAVA_SOURCE_DIR", CM_NULLPTR);
    this->SetPropertyDefault("ANDROID_JAR_DIRECTORIES", CM_NULLPTR);
    this->SetPropertyDefault("ANDROID_JAR_DEPENDENCIES", CM_NULLPTR);
    this->SetPropertyDefault("ANDROID_ASSETS_DIRECTORIES", CM_NULLPTR);
    this->SetPropertyDefault("ANDROID_ANT_ADDITIONAL_OPTIONS", CM_NULLPTR);
    this->SetPropertyDefault("BUILD_RPATH", CM_NULLPTR);
    this->SetPropertyDefault("INSTALL_NAME_DIR", CM_NULLPTR);
    this->SetPropertyDefault("INSTALL_RPATH", "");
    this->SetPropertyDefault("INSTALL_RPATH_USE_LINK_PATH", "OFF");
    this->SetPropertyDefault("INTERPROCEDURAL_OPTIMIZATION", CM_NULLPTR);
    this->SetPropertyDefault("SKIP_BUILD_RPATH", "OFF");
    this->SetPropertyDefault("BUILD_WITH_INSTALL_RPATH", "OFF");
    this->SetPropertyDefault("ARCHIVE_OUTPUT_DIRECTORY", CM_NULLPTR);
    this->SetPropertyDefault("LIBRARY_OUTPUT_DIRECTORY", CM_NULLPTR);
    this->SetPropertyDefault("RUNTIME_OUTPUT_DIRECTORY", CM_NULLPTR);
    this->SetPropertyDefault("PDB_OUTPUT_DIRECTORY", CM_NULLPTR);
    this->SetPropertyDefault("COMPILE_PDB_OUTPUT_DIRECTORY", CM_NULLPTR);
    this->SetPropertyDefault("Fortran_FORMAT", CM_NULLPTR);
    this->SetPropertyDefault("Fortran_MODULE_DIRECTORY", CM_NULLPTR);
    this->SetPropertyDefault("GNUtoMS", CM_NULLPTR);
    this->SetPropertyDefault("OSX_ARCHITECTURES", CM_NULLPTR);
    this->SetPropertyDefault("IOS_INSTALL_COMBINED", CM_NULLPTR);
    this->SetPropertyDefault("AUTOMOC", CM_NULLPTR);
    this->SetPropertyDefault("AUTOUIC", CM_NULLPTR);
    this->SetPropertyDefault("AUTORCC", CM_NULLPTR);
    this->SetPropertyDefault("AUTOMOC_DEPEND_FILTERS", CM_NULLPTR);
    this->SetPropertyDefault("AUTOMOC_MOC_OPTIONS", CM_NULLPTR);
    this->SetPropertyDefault("AUTOUIC_OPTIONS", CM_NULLPTR);
    this->SetPropertyDefault("AUTOUIC_SEARCH_PATHS", CM_NULLPTR);
    this->SetPropertyDefault("AUTORCC_OPTIONS", CM_NULLPTR);
    this->SetPropertyDefault("LINK_DEPENDS_NO_SHARED", CM_NULLPTR);
    this->SetPropertyDefault("LINK_INTERFACE_LIBRARIES", CM_NULLPTR);
    this->SetPropertyDefault("WIN32_EXECUTABLE", CM_NULLPTR);
    this->SetPropertyDefault("MACOSX_BUNDLE", CM_NULLPTR);
    this->SetPropertyDefault("MACOSX_RPATH", CM_NULLPTR);
    this->SetPropertyDefault("BUILD_WITH_INSTALL_NAME_DIR", CM_NULLPTR);
    this->SetPropertyDefault("C_CLANG_TIDY", CM_NULLPTR);
    this->SetPropertyDefault("C_COMPILER_LAUNCHER", CM_NULLPTR);
    this->SetPropertyDefault("C_CPPLINT", CM_NULLPTR);
    this->SetPropertyDefault("C_INCLUDE_WHAT_YOU_USE", CM_NULLPTR);
    this->SetPropertyDefault("LINK_WHAT_YOU_USE", CM_NULLPTR);
    this->SetPropertyDefault("C_STANDARD", CM_NULLPTR);
    this->SetPropertyDefault("C_STANDARD_REQUIRED", CM_NULLPTR);
    this->SetPropertyDefault("C_EXTENSIONS", CM_NULLPTR);
    this->SetPropertyDefault("CXX_CLANG_TIDY", CM_NULLPTR);
    this->SetPropertyDefault("CXX_COMPILER_LAUNCHER", CM_NULLPTR);
    this->SetPropertyDefault("CXX_CPPLINT", CM_NULLPTR);
    this->SetPropertyDefault("CXX_INCLUDE_WHAT_YOU_USE", CM_NULLPTR);
    this->SetPropertyDefault("CXX_STANDARD", CM_NULLPTR);
    this->SetPropertyDefault("CXX_STANDARD_REQUIRED", CM_NULLPTR);
    this->SetPropertyDefault("CXX_EXTENSIONS", CM_NULLPTR);
    this->SetPropertyDefault("CUDA_STANDARD", CM_NULLPTR);
    this->SetPropertyDefault("CUDA_STANDARD_REQUIRED", CM_NULLPTR);
    this->SetPropertyDefault("CUDA_EXTENSIONS", CM_NULLPTR);
    this->SetPropertyDefault("CUDA_COMPILER_LAUNCHER", CM_NULLPTR);
    this->SetPropertyDefault("LINK_SEARCH_START_STATIC", CM_NULLPTR);
    this->SetPropertyDefault("LINK_SEARCH_END_STATIC", CM_NULLPTR);
  }

  if (this->GetType() != cmStateEnums::UTILITY) {
    this->SetPropertyDefault("NO_SYSTEM_FROM_IMPORTED", CM_NULLPTR);
  }

  // Collect the set of configuration types.
  std::vector<std::string> configNames;
  mf->GetConfigurations(configNames);

  // Setup per-configuration property default values.
  if (this->GetType() != cmStateEnums::UTILITY) {
    const char* configProps[] = {
      /* clang-format needs this comment to break after the opening brace */
      "ARCHIVE_OUTPUT_DIRECTORY_",     "LIBRARY_OUTPUT_DIRECTORY_",
      "RUNTIME_OUTPUT_DIRECTORY_",     "PDB_OUTPUT_DIRECTORY_",
      "COMPILE_PDB_OUTPUT_DIRECTORY_", "MAP_IMPORTED_CONFIG_",
      "INTERPROCEDURAL_OPTIMIZATION_", CM_NULLPTR
    };
    for (std::vector<std::string>::iterator ci = configNames.begin();
         ci != configNames.end(); ++ci) {
      std::string configUpper = cmSystemTools::UpperCase(*ci);
      for (const char** p = configProps; *p; ++p) {
        // Interface libraries have no output locations, so honor only
        // the configuration map.
        if (this->TargetTypeValue == cmStateEnums::INTERFACE_LIBRARY &&
            strcmp(*p, "MAP_IMPORTED_CONFIG_") != 0) {
          continue;
        }
        std::string property = *p;
        property += configUpper;
        this->SetPropertyDefault(property, CM_NULLPTR);
      }

      // Initialize per-configuration name postfix property from the
      // variable only for non-executable targets.  This preserves
      // compatibility with previous CMake versions in which executables
      // did not support this variable.  Projects may still specify the
      // property directly.
      if (this->TargetTypeValue != cmStateEnums::EXECUTABLE &&
          this->TargetTypeValue != cmStateEnums::INTERFACE_LIBRARY) {
        std::string property = cmSystemTools::UpperCase(*ci);
        property += "_POSTFIX";
        this->SetPropertyDefault(property, CM_NULLPTR);
      }
    }
  }

  // Save the backtrace of target construction.
  this->Backtrace = this->Makefile->GetBacktrace();

  if (!this->IsImported()) {
    // Initialize the INCLUDE_DIRECTORIES property based on the current value
    // of the same directory property:
    const cmStringRange parentIncludes =
      this->Makefile->GetIncludeDirectoriesEntries();
    const cmBacktraceRange parentIncludesBts =
      this->Makefile->GetIncludeDirectoriesBacktraces();

    this->Internal->IncludeDirectoriesEntries.insert(
      this->Internal->IncludeDirectoriesEntries.end(), parentIncludes.begin(),
      parentIncludes.end());
    this->Internal->IncludeDirectoriesBacktraces.insert(
      this->Internal->IncludeDirectoriesBacktraces.end(),
      parentIncludesBts.begin(), parentIncludesBts.end());

    const std::set<std::string> parentSystemIncludes =
      this->Makefile->GetSystemIncludeDirectories();

    this->SystemIncludeDirectories.insert(parentSystemIncludes.begin(),
                                          parentSystemIncludes.end());

    const cmStringRange parentOptions =
      this->Makefile->GetCompileOptionsEntries();
    const cmBacktraceRange parentOptionsBts =
      this->Makefile->GetCompileOptionsBacktraces();

    this->Internal->CompileOptionsEntries.insert(
      this->Internal->CompileOptionsEntries.end(), parentOptions.begin(),
      parentOptions.end());
    this->Internal->CompileOptionsBacktraces.insert(
      this->Internal->CompileOptionsBacktraces.end(), parentOptionsBts.begin(),
      parentOptionsBts.end());
  }

  if (this->GetType() != cmStateEnums::INTERFACE_LIBRARY &&
      this->GetType() != cmStateEnums::UTILITY) {
    this->SetPropertyDefault("C_VISIBILITY_PRESET", CM_NULLPTR);
    this->SetPropertyDefault("CXX_VISIBILITY_PRESET", CM_NULLPTR);
    this->SetPropertyDefault("CUDA_VISIBILITY_PRESET", CM_NULLPTR);
    this->SetPropertyDefault("VISIBILITY_INLINES_HIDDEN", CM_NULLPTR);
  }

  if (this->TargetTypeValue == cmStateEnums::EXECUTABLE) {
    this->SetPropertyDefault("ANDROID_GUI", CM_NULLPTR);
    this->SetPropertyDefault("CROSSCOMPILING_EMULATOR", CM_NULLPTR);
    this->SetPropertyDefault("ENABLE_EXPORTS", CM_NULLPTR);
  }
  if (this->TargetTypeValue == cmStateEnums::SHARED_LIBRARY ||
      this->TargetTypeValue == cmStateEnums::MODULE_LIBRARY) {
    this->SetProperty("POSITION_INDEPENDENT_CODE", "True");
  }
  if (this->TargetTypeValue == cmStateEnums::SHARED_LIBRARY ||
      this->TargetTypeValue == cmStateEnums::EXECUTABLE) {
    this->SetPropertyDefault("WINDOWS_EXPORT_ALL_SYMBOLS", CM_NULLPTR);
  }

  if (this->GetType() != cmStateEnums::INTERFACE_LIBRARY &&
      this->GetType() != cmStateEnums::UTILITY) {
    this->SetPropertyDefault("POSITION_INDEPENDENT_CODE", CM_NULLPTR);
  }

  // Record current policies for later use.
  this->Makefile->RecordPolicies(this->PolicyMap);

  if (this->TargetTypeValue == cmStateEnums::INTERFACE_LIBRARY) {
    // This policy is checked in a few conditions. The properties relevant
    // to the policy are always ignored for cmStateEnums::INTERFACE_LIBRARY
    // targets,
    // so ensure that the conditions don't lead to nonsense.
    this->PolicyMap.Set(cmPolicies::CMP0022, cmPolicies::NEW);
  }

  if (this->GetType() != cmStateEnums::INTERFACE_LIBRARY &&
      this->GetType() != cmStateEnums::UTILITY) {
    this->SetPropertyDefault("JOB_POOL_COMPILE", CM_NULLPTR);
    this->SetPropertyDefault("JOB_POOL_LINK", CM_NULLPTR);
  }
}